

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cpp
# Opt level: O1

int mbedtls_mpi_div_mpi(mbedtls_mpi *Q,mbedtls_mpi *R,mbedtls_mpi *A,mbedtls_mpi *B)

{
  mbedtls_mpi_uint *pmVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  mbedtls_mpi_uint mVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  mbedtls_mpi Y;
  mbedtls_mpi Z;
  mbedtls_mpi T1;
  mbedtls_mpi X;
  mbedtls_mpi_uint p_1 [1];
  mbedtls_mpi_uint p [1];
  mbedtls_mpi_uint TP2 [3];
  mbedtls_mpi T2;
  mbedtls_mpi local_e8;
  mbedtls_mpi local_d8;
  mbedtls_mpi local_c8;
  mbedtls_mpi local_b8;
  ulong local_a8;
  ulong local_a0;
  size_t local_98;
  ulong local_90;
  ulong local_88;
  mbedtls_mpi_uint local_80;
  mbedtls_mpi local_78;
  size_t local_68;
  ulong local_60;
  mbedtls_mpi local_58;
  mbedtls_mpi_uint local_48;
  mbedtls_mpi local_40;
  
  local_58.p = (mbedtls_mpi_uint *)&local_78;
  local_78.p = (mbedtls_mpi_uint *)0x0;
  local_58._8_4_ = 0x10001;
  iVar2 = mbedtls_mpi_cmp_mpi(B,&local_58);
  if (iVar2 == 0) {
    return -0xc;
  }
  local_b8.s = 1;
  local_b8.n = 0;
  local_b8.p = (mbedtls_mpi_uint *)0x0;
  local_e8.s = 1;
  local_e8.n = 0;
  local_e8.p = (mbedtls_mpi_uint *)0x0;
  local_d8.s = 1;
  local_d8.n = 0;
  local_d8.p = (mbedtls_mpi_uint *)0x0;
  local_c8.s = 1;
  local_c8.n = 0;
  local_c8.p = (mbedtls_mpi_uint *)0x0;
  local_40.s = 1;
  local_40.n = 3;
  local_40.p = (mbedtls_mpi_uint *)&local_58;
  iVar2 = mbedtls_mpi_cmp_abs(A,B);
  if (iVar2 < 0) {
    if (Q != (mbedtls_mpi *)0x0) {
      iVar2 = mbedtls_mpi_grow(Q,1);
      if (iVar2 != 0) goto LAB_0034fabf;
      memset(Q->p,0,(ulong)Q->n << 3);
      *Q->p = 0;
      Q->s = 1;
    }
    if (R == (mbedtls_mpi *)0x0) {
      return 0;
    }
    iVar2 = mbedtls_mpi_copy(R,A);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    iVar2 = mbedtls_mpi_copy(&local_b8,A);
    if ((iVar2 == 0) && (iVar2 = mbedtls_mpi_copy(&local_e8,B), iVar2 == 0)) {
      local_e8.s = 1;
      local_b8.s = 1;
      iVar2 = mbedtls_mpi_grow(&local_d8,(ulong)A->n + 2);
      if ((iVar2 == 0) && (iVar2 = mbedtls_mpi_grow(&local_d8,1), iVar2 == 0)) {
        memset(local_d8.p,0,(ulong)local_d8.n << 3);
        *local_d8.p = 0;
        local_d8.s = 1;
        iVar2 = mbedtls_mpi_grow(&local_c8,(ulong)A->n + 2);
        if (iVar2 == 0) {
          sVar4 = mbedtls_mpi_core_bitlen(local_e8.p,(ulong)local_e8.n);
          uVar9 = (ulong)((uint)sVar4 & 0x3f);
          if (uVar9 == 0x3f) {
            uVar9 = 0;
          }
          else {
            uVar9 = uVar9 ^ 0x3f;
            iVar2 = mbedtls_mpi_shift_l(&local_b8,uVar9);
            if ((iVar2 != 0) || (iVar2 = mbedtls_mpi_shift_l(&local_e8,uVar9), iVar2 != 0))
            goto LAB_0034fabf;
          }
          local_a8 = (ulong)local_b8.n;
          local_a0 = (ulong)local_e8.n;
          local_90 = local_a8 - local_a0;
          local_98 = local_90 * 0x40;
          iVar2 = mbedtls_mpi_shift_l(&local_e8,local_98);
          if (iVar2 == 0) {
            local_88 = local_a0 - 1;
            local_60 = uVar9;
            do {
              iVar2 = mbedtls_mpi_cmp_mpi(&local_b8,&local_e8);
              if (iVar2 < 0) {
                if ((ulong)local_e8.n != 0) {
                  mbedtls_mpi_core_shift_r(local_e8.p,(ulong)local_e8.n,local_98);
                }
                uVar9 = local_a8 - 1;
                if (uVar9 <= local_88) goto LAB_0034fe2f;
                local_98 = ~local_a0;
                uVar8 = local_a8;
                goto LAB_0034fbf2;
              }
              local_d8.p[local_90] = local_d8.p[local_90] + 1;
              iVar2 = add_sub_mpi(&local_b8,&local_b8,&local_e8,-1);
            } while (iVar2 == 0);
          }
        }
      }
    }
  }
  goto LAB_0034fabf;
  while( true ) {
    local_68 = uVar9 << 6;
    iVar2 = mbedtls_mpi_shift_l(&local_c8,local_68);
    if (iVar2 != 0) goto LAB_0034fabf;
    iVar2 = add_sub_mpi(&local_b8,&local_b8,&local_c8,-1);
    if (iVar2 != 0) goto LAB_0034fabf;
    local_80 = 0;
    local_78.s = 1;
    local_78.n = 1;
    local_78.p = &local_80;
    iVar2 = mbedtls_mpi_cmp_mpi(&local_b8,&local_78);
    if (iVar2 < 0) {
      iVar2 = mbedtls_mpi_copy(&local_c8,&local_e8);
      if (((iVar2 != 0) || (iVar2 = mbedtls_mpi_shift_l(&local_c8,local_68), iVar2 != 0)) ||
         (iVar2 = add_sub_mpi(&local_b8,&local_b8,&local_c8,1), iVar2 != 0)) goto LAB_0034fabf;
      local_d8.p[local_a8] = local_d8.p[local_a8] - 1;
    }
    uVar9 = local_90 - 1;
    uVar8 = local_90;
    if (uVar9 <= local_88) break;
LAB_0034fbf2:
    pmVar1 = local_b8.p;
    uVar6 = 0xffffffffffffffff;
    local_90 = uVar9;
    if (local_b8.p[uVar9] < local_e8.p[local_a0 - 1]) {
      auVar10 = __udivti3(local_b8.p[uVar8 - 2],local_b8.p[uVar9],local_e8.p[local_a0 - 1],0);
      uVar6 = -(ulong)(auVar10._8_8_ != 0) | auVar10._0_8_;
    }
    local_d8.p[uVar8 + local_98] = uVar6;
    if (local_90 < 2) {
      local_58.p = (mbedtls_mpi_uint *)0x0;
    }
    else {
      local_58.p = (mbedtls_mpi_uint *)pmVar1[uVar8 - 3];
    }
    local_58._8_8_ = pmVar1[uVar8 - 2];
    local_48 = pmVar1[local_90];
    local_a8 = uVar8 + local_98;
    local_d8.p[local_a8] = local_d8.p[local_a8] + 1;
    do {
      uVar9 = local_a0;
      local_d8.p[local_a8] = local_d8.p[local_a8] - 1;
      iVar2 = mbedtls_mpi_lset(&local_c8,0);
      if (iVar2 != 0) goto LAB_0034fabf;
      if (local_88 == 0) {
        mVar5 = 0;
      }
      else {
        mVar5 = local_e8.p[uVar9 - 2];
      }
      *local_c8.p = mVar5;
      local_c8.p[1] = local_e8.p[uVar9 - 1];
      iVar2 = mbedtls_mpi_mul_int(&local_c8,&local_c8,local_d8.p[local_a8]);
      if (iVar2 != 0) goto LAB_0034fabf;
      iVar2 = mbedtls_mpi_cmp_mpi(&local_c8,&local_40);
      uVar9 = local_a8;
    } while (0 < iVar2);
    iVar2 = mbedtls_mpi_mul_int(&local_c8,&local_e8,local_d8.p[local_a8]);
    if (iVar2 != 0) goto LAB_0034fabf;
  }
LAB_0034fe2f:
  if (Q != (mbedtls_mpi *)0x0) {
    iVar2 = mbedtls_mpi_copy(Q,&local_d8);
    if (iVar2 != 0) goto LAB_0034fabf;
    Q->s = B->s * A->s;
  }
  iVar7 = 0;
  iVar2 = iVar7;
  if (R != (mbedtls_mpi *)0x0) {
    if ((ulong)local_b8.n != 0) {
      mbedtls_mpi_core_shift_r(local_b8.p,(ulong)local_b8.n,local_60);
    }
    local_b8.s = A->s;
    iVar2 = mbedtls_mpi_copy(R,&local_b8);
    if (iVar2 == 0) {
      local_78.p = &local_80;
      local_80 = 0;
      local_78.s = 1;
      local_78.n = 1;
      iVar3 = mbedtls_mpi_cmp_mpi(R,&local_78);
      iVar2 = iVar7;
      if (iVar3 == 0) {
        R->s = 1;
      }
    }
  }
LAB_0034fabf:
  if (local_b8.p != (mbedtls_mpi_uint *)0x0) {
    mbedtls_zeroize_and_free(local_b8.p,(ulong)local_b8.n << 3);
  }
  local_b8.s = 1;
  local_b8.n = 0;
  local_b8.p = (mbedtls_mpi_uint *)0x0;
  if (local_e8.p != (mbedtls_mpi_uint *)0x0) {
    mbedtls_zeroize_and_free(local_e8.p,(ulong)local_e8.n << 3);
  }
  local_e8.s = 1;
  local_e8.n = 0;
  local_e8.p = (mbedtls_mpi_uint *)0x0;
  if (local_d8.p != (mbedtls_mpi_uint *)0x0) {
    mbedtls_zeroize_and_free(local_d8.p,(ulong)local_d8.n << 3);
  }
  local_d8.s = 1;
  local_d8.n = 0;
  local_d8.p = (mbedtls_mpi_uint *)0x0;
  if (local_c8.p != (mbedtls_mpi_uint *)0x0) {
    mbedtls_zeroize_and_free(local_c8.p,(ulong)local_c8.n << 3);
  }
  local_c8.s = 1;
  local_c8.n = 0;
  local_c8.p = (mbedtls_mpi_uint *)0x0;
  mbedtls_platform_zeroize(&local_58,0x18);
  return iVar2;
}

Assistant:

int mbedtls_mpi_div_mpi(mbedtls_mpi *Q, mbedtls_mpi *R, const mbedtls_mpi *A,
                        const mbedtls_mpi *B)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t i, n, t, k;
    mbedtls_mpi X, Y, Z, T1, T2;
    mbedtls_mpi_uint TP2[3];

    if (mbedtls_mpi_cmp_int(B, 0) == 0) {
        return MBEDTLS_ERR_MPI_DIVISION_BY_ZERO;
    }

    mbedtls_mpi_init(&X); mbedtls_mpi_init(&Y); mbedtls_mpi_init(&Z);
    mbedtls_mpi_init(&T1);
    /*
     * Avoid dynamic memory allocations for constant-size T2.
     *
     * T2 is used for comparison only and the 3 limbs are assigned explicitly,
     * so nobody increase the size of the MPI and we're safe to use an on-stack
     * buffer.
     */
    T2.s = 1;
    T2.n = sizeof(TP2) / sizeof(*TP2);
    T2.p = TP2;

    if (mbedtls_mpi_cmp_abs(A, B) < 0) {
        if (Q != NULL) {
            MBEDTLS_MPI_CHK(mbedtls_mpi_lset(Q, 0));
        }
        if (R != NULL) {
            MBEDTLS_MPI_CHK(mbedtls_mpi_copy(R, A));
        }
        return 0;
    }

    MBEDTLS_MPI_CHK(mbedtls_mpi_copy(&X, A));
    MBEDTLS_MPI_CHK(mbedtls_mpi_copy(&Y, B));
    X.s = Y.s = 1;

    MBEDTLS_MPI_CHK(mbedtls_mpi_grow(&Z, A->n + 2));
    MBEDTLS_MPI_CHK(mbedtls_mpi_lset(&Z,  0));
    MBEDTLS_MPI_CHK(mbedtls_mpi_grow(&T1, A->n + 2));

    k = mbedtls_mpi_bitlen(&Y) % biL;
    if (k < biL - 1) {
        k = biL - 1 - k;
        MBEDTLS_MPI_CHK(mbedtls_mpi_shift_l(&X, k));
        MBEDTLS_MPI_CHK(mbedtls_mpi_shift_l(&Y, k));
    } else {
        k = 0;
    }

    n = X.n - 1;
    t = Y.n - 1;
    MBEDTLS_MPI_CHK(mbedtls_mpi_shift_l(&Y, biL * (n - t)));

    while (mbedtls_mpi_cmp_mpi(&X, &Y) >= 0) {
        Z.p[n - t]++;
        MBEDTLS_MPI_CHK(mbedtls_mpi_sub_mpi(&X, &X, &Y));
    }
    MBEDTLS_MPI_CHK(mbedtls_mpi_shift_r(&Y, biL * (n - t)));

    for (i = n; i > t; i--) {
        if (X.p[i] >= Y.p[t]) {
            Z.p[i - t - 1] = ~(mbedtls_mpi_uint) 0u;
        } else {
            Z.p[i - t - 1] = mbedtls_int_div_int(X.p[i], X.p[i - 1],
                                                 Y.p[t], NULL);
        }

        T2.p[0] = (i < 2) ? 0 : X.p[i - 2];
        T2.p[1] = (i < 1) ? 0 : X.p[i - 1];
        T2.p[2] = X.p[i];

        Z.p[i - t - 1]++;
        do {
            Z.p[i - t - 1]--;

            MBEDTLS_MPI_CHK(mbedtls_mpi_lset(&T1, 0));
            T1.p[0] = (t < 1) ? 0 : Y.p[t - 1];
            T1.p[1] = Y.p[t];
            MBEDTLS_MPI_CHK(mbedtls_mpi_mul_int(&T1, &T1, Z.p[i - t - 1]));
        } while (mbedtls_mpi_cmp_mpi(&T1, &T2) > 0);

        MBEDTLS_MPI_CHK(mbedtls_mpi_mul_int(&T1, &Y, Z.p[i - t - 1]));
        MBEDTLS_MPI_CHK(mbedtls_mpi_shift_l(&T1,  biL * (i - t - 1)));
        MBEDTLS_MPI_CHK(mbedtls_mpi_sub_mpi(&X, &X, &T1));

        if (mbedtls_mpi_cmp_int(&X, 0) < 0) {
            MBEDTLS_MPI_CHK(mbedtls_mpi_copy(&T1, &Y));
            MBEDTLS_MPI_CHK(mbedtls_mpi_shift_l(&T1, biL * (i - t - 1)));
            MBEDTLS_MPI_CHK(mbedtls_mpi_add_mpi(&X, &X, &T1));
            Z.p[i - t - 1]--;
        }
    }

    if (Q != NULL) {
        MBEDTLS_MPI_CHK(mbedtls_mpi_copy(Q, &Z));
        Q->s = A->s * B->s;
    }

    if (R != NULL) {
        MBEDTLS_MPI_CHK(mbedtls_mpi_shift_r(&X, k));
        X.s = A->s;
        MBEDTLS_MPI_CHK(mbedtls_mpi_copy(R, &X));

        if (mbedtls_mpi_cmp_int(R, 0) == 0) {
            R->s = 1;
        }
    }

cleanup:

    mbedtls_mpi_free(&X); mbedtls_mpi_free(&Y); mbedtls_mpi_free(&Z);
    mbedtls_mpi_free(&T1);
    mbedtls_platform_zeroize(TP2, sizeof(TP2));

    return ret;
}